

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb3Nonlin.c
# Opt level: O2

int Llb_NonlinFindBestVar(DdManager *dd,DdNode *bFunc,Aig_Man_t *pAig)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  abctime aVar8;
  void *pvVar9;
  DdNode *pDVar10;
  DdNode *n;
  Aig_Obj_t *pAVar11;
  abctime aVar12;
  abctime time;
  uint i;
  ulong uVar13;
  ulong uVar14;
  uint local_60;
  
  aVar8 = Abc_Clock();
  uVar2 = Cudd_DagSize(bFunc);
  local_60 = 1000000000;
  uVar14 = 0xffffffffffffffff;
  uVar13 = 0xffffffff;
  for (uVar3 = 0; i = (uint)uVar13, (int)uVar3 < pAig->nRegs; uVar3 = uVar3 + 1) {
    pvVar9 = Vec_PtrEntry(pAig->vCis,pAig->nTruePis + uVar3);
    pDVar10 = Cudd_bddIthVar(dd,*(int *)((long)pvVar9 + 0x24));
    n = Cudd_bddAnd(dd,bFunc,(DdNode *)((ulong)pDVar10 ^ 1));
    Cudd_Ref(n);
    uVar4 = Cudd_DagSize(n);
    Cudd_RecursiveDeref(dd,n);
    pDVar10 = Cudd_bddAnd(dd,bFunc,pDVar10);
    Cudd_Ref(pDVar10);
    iVar5 = Cudd_DagSize(pDVar10);
    Cudd_RecursiveDeref(dd,pDVar10);
    iVar6 = uVar4 - iVar5;
    iVar1 = -iVar6;
    if (0 < iVar6) {
      iVar1 = iVar6;
    }
    uVar7 = (uVar4 - uVar2) + iVar5 + iVar1;
    uVar14 = uVar14 & 0xffffffff;
    if ((1 < iVar5 && 1 < (int)uVar4) && (int)uVar7 < (int)local_60) {
      uVar14 = (ulong)uVar4;
      i = uVar3;
      local_60 = uVar7;
    }
    uVar13 = (ulong)i;
  }
  pAVar11 = Saig_ManLo(pAig,i);
  printf("BestVar = %4d/%4d.  Value =%6d.  Orig =%6d. Size0 =%6d. ",uVar13,(ulong)(uint)pAVar11->Id,
         (ulong)local_60,(ulong)uVar2,uVar14 & 0xffffffff);
  aVar12 = Abc_Clock();
  Abc_PrintTime(0x82525c,(char *)(aVar12 - aVar8),time);
  return i;
}

Assistant:

int Llb_NonlinFindBestVar( DdManager * dd, DdNode * bFunc, Aig_Man_t * pAig )
{
    int fVerbose = 0;
    Aig_Obj_t * pObj;
    DdNode * bCof, * bVar;
    int i, iVar, iVarBest = -1, iValue, iValueBest = ABC_INFINITY, Size0Best = -1;
    int Size, Size0, Size1;
    abctime clk = Abc_Clock();
    Size = Cudd_DagSize(bFunc);
//    printf( "Original = %6d.  SuppSize = %3d. Vars = %3d.\n", 
//        Size = Cudd_DagSize(bFunc), Cudd_SupportSize(dd, bFunc), Aig_ManRegNum(pAig) );
    Saig_ManForEachLo( pAig, pObj, i )
    {
        iVar = Aig_ObjId(pObj);

if ( fVerbose )
printf( "Var =%3d : ", iVar );
        bVar = Cudd_bddIthVar(dd, iVar);

        bCof = Cudd_bddAnd( dd, bFunc, Cudd_Not(bVar) );          Cudd_Ref( bCof );
        Size0 = Cudd_DagSize(bCof);
if ( fVerbose )
printf( "Supp0 =%3d  ",  Cudd_SupportSize(dd, bCof) );
if ( fVerbose )
printf( "Size0 =%6d   ", Size0 );
        Cudd_RecursiveDeref( dd, bCof );

        bCof = Cudd_bddAnd( dd, bFunc, bVar );                    Cudd_Ref( bCof );
        Size1 = Cudd_DagSize(bCof);
if ( fVerbose )
printf( "Supp1 =%3d  ",  Cudd_SupportSize(dd, bCof) );
if ( fVerbose )
printf( "Size1 =%6d   ", Size1 );
        Cudd_RecursiveDeref( dd, bCof );

        iValue = Abc_MaxInt(Size0, Size1) - Abc_MinInt(Size0, Size1) + Size0 + Size1 - Size;
if ( fVerbose )
printf( "D =%6d  ", Size0 + Size1 - Size );
if ( fVerbose )
printf( "B =%6d  ", Abc_MaxInt(Size0, Size1) - Abc_MinInt(Size0, Size1) );
if ( fVerbose )
printf( "S =%6d\n", iValue );
        if ( Size0 > 1 && Size1 > 1 && iValueBest > iValue )
        {
            iValueBest = iValue;
            iVarBest   = i;
            Size0Best  = Size0;
        }
    }
    printf( "BestVar = %4d/%4d.  Value =%6d.  Orig =%6d. Size0 =%6d. ", 
        iVarBest, Aig_ObjId(Saig_ManLo(pAig,iVarBest)), iValueBest, Size, Size0Best );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    return iVarBest;
}